

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O0

void __thiscall YdiskRestClient::move(YdiskRestClient *this,string *from,string *to,BOOL overwrite)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  SSLClient *path;
  Headers *headers;
  element_type *peVar1;
  element_type *peVar2;
  char *pcVar3;
  undefined1 local_110 [8];
  shared_ptr<httplib::Response> r;
  string empty_body;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator local_49;
  string local_48 [8];
  string url;
  BOOL overwrite_local;
  string *to_local;
  string *from_local;
  YdiskRestClient *this_local;
  
  url.field_2._12_4_ = overwrite;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"/v1/disk/resources/move?from=",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  url_encode(&local_c0,this,from);
  std::operator+(&local_a0,&local_c0,"&path=");
  url_encode((string *)((long)&empty_body.field_2 + 8),this,to);
  std::operator+(&local_80,&local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&empty_body.field_2 + 8));
  std::__cxx11::string::operator+=(local_48,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)(empty_body.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::operator+=(local_48,"&overwrite=");
  pcVar3 = "false";
  if (url.field_2._12_4_ == 1) {
    pcVar3 = "true";
  }
  std::__cxx11::string::operator+=(local_48,pcVar3);
  this_00 = &r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::string((string *)this_00);
  path = this->http_client;
  headers = (Headers *)std::__cxx11::string::c_str();
  httplib::Client::Post
            ((Client *)local_110,(char *)path,headers,(string *)&this->headers,(char *)this_00);
  peVar1 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_110);
  if ((peVar1 == (element_type *)0x0) ||
     (peVar2 = std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_110), peVar2->status != 0xc9)) {
    peVar1 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_110);
    if ((peVar1 == (element_type *)0x0) ||
       (peVar2 = std::
                 __shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_110), peVar2->status != 0xca)) {
      peVar1 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_110);
      throw_response_error(this,peVar1);
    }
    else {
      peVar2 = std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_110);
      wait_success_operation(this,&peVar2->body);
    }
  }
  std::shared_ptr<httplib::Response>::~shared_ptr((shared_ptr<httplib::Response> *)local_110);
  std::__cxx11::string::~string
            ((string *)
             &r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void YdiskRestClient::move(std::string from, std::string to, BOOL overwrite)
{
    std::string url("/v1/disk/resources/move?from=");
    url += url_encode(from) + "&path=" + url_encode(to);
    url += "&overwrite=";
    url += (overwrite == true ? "true": "false");
    std::string empty_body;
    auto r = http_client->Post(url.c_str(), headers, empty_body, "text/plain");

    if(r.get() && r->status==201){
        //success
        return;
    } else if(r.get() && r->status==202){
        //not empty folder is moving, get operation status
        wait_success_operation(r->body);
        return;
    } else {
        throw_response_error(r.get());
    }
}